

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Bmc_EsPar_t *pBVar2;
  long lVar3;
  long lVar4;
  int (*paiVar5) [32];
  
  p_00 = Vec_IntAlloc(100);
  lVar4 = (long)p->pPars->nVars;
  paiVar5 = p->pFanins + lVar4;
  while( true ) {
    if (p->nObjs <= lVar4) {
      iVar1 = bmcg_sat_solver_addclause(p->pSat,p_00->pArray,p_00->nSize);
      if (iVar1 != 0) {
        Vec_IntFree(p_00);
      }
      return (uint)(iVar1 != 0);
    }
    iVar1 = Zyx_ManCollectFanins(p,(int)lVar4);
    pBVar2 = p->pPars;
    if (iVar1 != pBVar2->nLutSize) break;
    for (lVar3 = 0; lVar3 < iVar1; lVar3 = lVar3 + 1) {
      iVar1 = Abc_Var2Lit(p->TopoBase + (*paiVar5)[lVar3] + ((int)lVar4 - pBVar2->nVars) * p->nObjs,
                          1);
      Vec_IntPush(p_00,iVar1);
      pBVar2 = p->pPars;
      iVar1 = pBVar2->nLutSize;
    }
    lVar4 = lVar4 + 1;
    paiVar5 = paiVar5 + 1;
  }
  __assert_fail("nFanins == p->pPars->nLutSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                ,0x3e0,"int Zyx_ManAddCnfBlockSolution(Zyx_Man_t *)");
}

Assistant:

int Zyx_ManAddCnfBlockSolution( Zyx_Man_t * p )
{
    Vec_Int_t * vLits = Vec_IntAlloc( 100 ); int i, k;
    for ( i = p->pPars->nVars; i < p->nObjs; i++ )
    {
        int nFanins = Zyx_ManCollectFanins( p, i );
        assert( nFanins == p->pPars->nLutSize );
        for ( k = 0; k < p->pPars->nLutSize; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(Zyx_TopoVar(p, i, p->pFanins[i][k]), 1) );
    }
    //Zyx_ManPrintVarMap( p, 1 );
    //Zyx_PrintClause( Vec_IntArray(vLits), Vec_IntSize(vLits) );
    if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) ) )
        return 0;
    Vec_IntFree( vLits );
    return 1;
}